

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O0

void __thiscall Indexer::make_spill(Indexer *this,DatasetBuilder *builder)

{
  string_view_t fmt;
  string_view_t fmt_00;
  string_view_t fmt_01;
  bool bVar1;
  bool bVar2;
  string *dataset_name_00;
  size_type sVar3;
  Indexer *in_RDI;
  OnDiskDataset *ds;
  iterator __end3;
  iterator __begin3;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range3;
  string *in_stack_000000c0;
  DatabaseSnapshot *in_stack_000000c8;
  string merged_name;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> candidates;
  bool stop;
  string *in_stack_00000220;
  path *in_stack_00000228;
  DatasetBuilder *in_stack_00000230;
  string dataset_name;
  TaskSpec *in_stack_00000758;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_stack_00000760;
  string *in_stack_00000768;
  path *in_stack_00000770;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_stack_fffffffffffffd38;
  DatabaseName *in_stack_fffffffffffffd40;
  DatabaseSnapshot *in_stack_fffffffffffffd48;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_stack_fffffffffffffd50;
  DatabaseSnapshot *dataset_ptr;
  Indexer *this_00;
  char *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  Indexer *in_stack_fffffffffffffd88;
  iterator in_stack_fffffffffffffda0;
  undefined1 local_249 [33];
  DatabaseName local_228;
  string local_188 [32];
  size_type local_168;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_stack_fffffffffffffec8;
  undefined1 local_f1 [33];
  DatabaseName local_d0;
  string local_30 [48];
  
  dataset_ptr = in_RDI->snap;
  this_00 = (Indexer *)local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(allocator<char> *)this_00);
  DatabaseSnapshot::allocate_name(in_stack_000000c8,in_stack_000000c0);
  dataset_name_00 = DatabaseName::get_filename_abi_cxx11_(&local_d0);
  std::__cxx11::string::string(local_30,(string *)dataset_name_00);
  DatabaseName::~DatabaseName(in_stack_fffffffffffffd40);
  std::__cxx11::string::~string((string *)(local_f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  ::fmt::v6::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38)
  ;
  fmt.size_ = (size_t)in_stack_fffffffffffffd50;
  fmt.data_ = (char *)in_stack_fffffffffffffd48;
  spdlog::debug<std::__cxx11::string>
            (fmt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd40);
  DatasetBuilder::save(in_stack_00000230,in_stack_00000228,in_stack_00000220);
  register_dataset(in_RDI,dataset_name_00);
  bVar1 = false;
  while (!bVar1) {
    created_dataset_ptrs(in_stack_fffffffffffffd88);
    OnDiskDataset::get_compact_candidates(in_stack_fffffffffffffec8);
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~vector
              (in_stack_fffffffffffffd50);
    sVar3 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::size
                      ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                       &stack0xfffffffffffffec8);
    if (sVar3 < 0x14) {
      ::fmt::v6::basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)in_stack_fffffffffffffd40,
                 (char *)in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd78 =
           (char *)std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::size
                             ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                               *)&stack0xfffffffffffffec8);
      fmt_01.size_ = (size_t)in_stack_fffffffffffffd50;
      fmt_01.data_ = (char *)in_stack_fffffffffffffd48;
      spdlog::debug<unsigned_long>(fmt_01,(unsigned_long *)in_stack_fffffffffffffd40);
      bVar1 = true;
    }
    else {
      ::fmt::v6::basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)in_stack_fffffffffffffd40,
                 (char *)in_stack_fffffffffffffd38);
      local_168 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::size
                            ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                              *)&stack0xfffffffffffffec8);
      fmt_00.size_ = (size_t)in_stack_fffffffffffffd50;
      fmt_00.data_ = (char *)in_stack_fffffffffffffd48;
      spdlog::debug<unsigned_long>(fmt_00,(unsigned_long *)in_stack_fffffffffffffd40);
      in_stack_fffffffffffffd48 = in_RDI->snap;
      in_stack_fffffffffffffd50 =
           (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)local_249;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(allocator<char> *)this_00);
      DatabaseSnapshot::allocate_name(in_stack_000000c8,in_stack_000000c0);
      in_stack_fffffffffffffd40 = (DatabaseName *)DatabaseName::get_filename_abi_cxx11_(&local_228);
      std::__cxx11::string::string(local_188,(string *)in_stack_fffffffffffffd40);
      DatabaseName::~DatabaseName(in_stack_fffffffffffffd40);
      std::__cxx11::string::~string((string *)(local_249 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_249);
      OnDiskDataset::merge(in_stack_00000770,in_stack_00000768,in_stack_00000760,in_stack_00000758);
      in_stack_fffffffffffffda0 =
           std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::begin
                     (in_stack_fffffffffffffd38);
      std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::end
                (in_stack_fffffffffffffd38);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                            *)in_stack_fffffffffffffd40,
                           (__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                            *)in_stack_fffffffffffffd38);
        if (!bVar2) break;
        __gnu_cxx::
        __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
        ::operator*((__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                     *)&stack0xfffffffffffffda0);
        remove_dataset(this_00,(OnDiskDataset *)dataset_ptr);
        __gnu_cxx::
        __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
        ::operator++((__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                      *)&stack0xfffffffffffffda0);
      }
      register_dataset(in_RDI,dataset_name_00);
      std::__cxx11::string::~string(local_188);
    }
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~vector
              (in_stack_fffffffffffffd50);
  }
  DatasetBuilder::clear((DatasetBuilder *)in_stack_fffffffffffffda0._M_current);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Indexer::make_spill(DatasetBuilder &builder) {
    auto dataset_name = snap->allocate_name().get_filename();
    spdlog::debug("New dataset: {}", dataset_name);
    builder.save(snap->db_base, dataset_name);
    register_dataset(dataset_name);
    bool stop = false;

    while (!stop) {
        std::vector<const OnDiskDataset *> candidates =
            OnDiskDataset::get_compact_candidates(created_dataset_ptrs());

        if (candidates.size() >= INDEXER_COMPACT_THRESHOLD) {
            spdlog::debug("Merging {} datasets", candidates.size());
            std::string merged_name = snap->allocate_name().get_filename();
            OnDiskDataset::merge(snap->db_base, merged_name, candidates,
                                 nullptr);
            for (const auto *ds : candidates) {
                remove_dataset(ds);
            }
            register_dataset(merged_name);
        } else {
            spdlog::debug("{} datasets, not merging", candidates.size());
            stop = true;
        }
    }

    builder.clear();
}